

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_vectorization.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  void *pvVar2;
  Vector4d *unaff_retaddr;
  Vector4d *in_stack_00000008;
  undefined1 local_78 [8];
  Vector4d result;
  Vector4d inputs [2];
  
  Vector4d::Vector4d((Vector4d *)(result.data + 3),1.0,1.0,1.0,1.0);
  Vector4d::Vector4d((Vector4d *)(inputs[0].data + 3),1.0,2.0,3.0,4.0);
  poVar1 = std::operator<<((ostream *)&std::cout,"address of input1: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,result.data + 3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"address of input2: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,inputs[0].data + 3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  operator+(in_stack_00000008,unaff_retaddr);
  poVar1 = operator<<((ostream *)&std::cout,(Vector4d *)local_78);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  Vector4d inputs[2] =  {{1, 1, 1, 1}, {1, 2, 3, 4}};

  std::cout << "address of input1: " << inputs[0].data << std::endl;
  std::cout << "address of input2: " << inputs[1].data << std::endl;

  Vector4d result = inputs[0] + inputs[1];

  std::cout << result << std::endl;

  return 0;
}